

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.cc
# Opt level: O3

uint8_t * __thiscall
proto2_unittest::TestParsingMergeLite_RepeatedFieldsGenerator_Group2::_InternalSerialize
          (TestParsingMergeLite_RepeatedFieldsGenerator_Group2 *this,uint8_t *target,
          EpsCopyOutputStream *stream)

{
  uint size;
  TestAllTypesLite *value;
  void *data;
  ulong uVar1;
  uint8_t *puVar2;
  
  if ((undefined1  [16])((undefined1  [16])this->field_0 & (undefined1  [16])0x1) !=
      (undefined1  [16])0x0) {
    value = (this->field_0)._impl_.field1_;
    target = google::protobuf::internal::WireFormatLite::InternalWriteMessage
                       (0x15,&value->super_MessageLite,(value->field_0)._impl_._cached_size_.atom_,
                        target,stream);
  }
  uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar1 & 1) != 0) {
    uVar1 = uVar1 & 0xfffffffffffffffe;
    data = *(void **)(uVar1 + 8);
    size = *(uint *)(uVar1 + 0x10);
    if ((long)stream->end_ - (long)target < (long)(int)size) {
      puVar2 = google::protobuf::io::EpsCopyOutputStream::WriteRawFallback(stream,data,size,target);
      return puVar2;
    }
    memcpy(target,data,(ulong)size);
    target = target + (int)size;
  }
  return target;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL TestParsingMergeLite_RepeatedFieldsGenerator_Group2::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const TestParsingMergeLite_RepeatedFieldsGenerator_Group2& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:proto2_unittest.TestParsingMergeLite.RepeatedFieldsGenerator.Group2)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  cached_has_bits = this_._impl_._has_bits_[0];
  // .proto2_unittest.TestAllTypesLite field1 = 21;
  if ((cached_has_bits & 0x00000001u) != 0) {
    target = ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
        21, *this_._impl_.field1_, this_._impl_.field1_->GetCachedSize(), target,
        stream);
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(
        this_._internal_metadata_.unknown_fields<std::string>(::google::protobuf::internal::GetEmptyString).data(),
        static_cast<int>(this_._internal_metadata_.unknown_fields<std::string>(::google::protobuf::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:proto2_unittest.TestParsingMergeLite.RepeatedFieldsGenerator.Group2)
  return target;
}